

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_noskills(CHAR_DATA *ch,char *argument)

{
  char *txt;
  
  txt = "You will no longer have your normal immortal skills when switched into a mob.\n\r";
  if (((uint)ch->comm[0] >> 0x1c & 1) == 0) {
    txt = "You will now have every skill when switched into a mob.\n\r";
  }
  ch->comm[0] = ch->comm[0] ^ 0x10000000;
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_noskills(CHAR_DATA *ch, char *argument)
{
	if (!IS_SET(ch->comm, COMM_SWITCHSKILLS))
	{
		SET_BIT(ch->comm, COMM_SWITCHSKILLS);

		send_to_char("You will now have every skill when switched into a mob.\n\r", ch);
	}
	else
	{
		REMOVE_BIT(ch->comm, COMM_SWITCHSKILLS);

		send_to_char("You will no longer have your normal immortal skills when switched into a mob.\n\r", ch);
	}
}